

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
::evaluate(UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
           *this,ExecutionContext *execCtx)

{
  int iVar1;
  undefined4 extraout_var;
  int elemNdx;
  int compNdx;
  long lVar2;
  float fVar3;
  ConstStridedValueAccess<64> CVar4;
  StridedValueAccess<64> SVar5;
  ExecConstValueAccess srcValue;
  ExecValueAccess dstValue;
  ConstStridedValueAccess<64> local_50;
  StridedValueAccess<64> local_40;
  
  (*this->m_child->_vptr_Expression[4])();
  iVar1 = (*this->m_child->_vptr_Expression[5])();
  local_50.m_type = (VariableType *)CONCAT44(extraout_var,iVar1);
  local_40.super_ConstStridedValueAccess<64>.m_type = &(this->m_inValueRange).m_type;
  local_40.super_ConstStridedValueAccess<64>.m_value =
       (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
       .super__Vector_impl_data._M_start;
  for (iVar1 = 0; iVar1 < (this->m_inValueRange).m_type.m_numElements; iVar1 = iVar1 + 1) {
    CVar4 = ConstStridedValueAccess<64>::component(&local_50,iVar1);
    SVar5 = StridedValueAccess<64>::component(&local_40,iVar1);
    for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      fVar3 = CVar4.m_value[lVar2].floatVal;
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      SVar5.super_ConstStridedValueAccess<64>.m_value[lVar2].floatVal = 1.0 / fVar3;
    }
  }
  return;
}

Assistant:

void UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::evaluate (ExecutionContext& execCtx)
{
	m_child->evaluate(execCtx);

	ExecConstValueAccess	srcValue	= m_child->getValue();
	ExecValueAccess			dstValue	= m_value.getValue(m_inValueRange.getType());

	for (int elemNdx = 0; elemNdx < m_inValueRange.getType().getNumElements(); elemNdx++)
	{
		ExecConstValueAccess	srcComp		= srcValue.component(elemNdx);
		ExecValueAccess			dstComp		= dstValue.component(elemNdx);

		for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			dstComp.asFloat(compNdx) = Evaluate()(srcComp.asFloat(compNdx));
	}
}